

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

MemoryMappedFile * __thiscall
MemoryMappedFile::operator=(MemoryMappedFile *this,MemoryMappedFile *f_other)

{
  this->mpMapped = f_other->mpMapped;
  f_other->mpMapped = (void *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->mFilename);
  (f_other->mFilename).super_String.mString._M_string_length = 0;
  *(f_other->mFilename).super_String.mString._M_dataplus._M_p = '\0';
  this->mAccessType = f_other->mAccessType;
  f_other->mAccessType = NO_ACCESS;
  this->mFd = f_other->mFd;
  f_other->mFd = -1;
  this->mFileSize = f_other->mFileSize;
  f_other->mFileSize = 0;
  return this;
}

Assistant:

MemoryMappedFile &MemoryMappedFile::operator=(MemoryMappedFile &&f_other)
{
    mpMapped = f_other.mpMapped;
    f_other.mpMapped = nullptr;

    mFilename = f_other.mFilename;
    f_other.mFilename.clear();

    mAccessType = f_other.mAccessType;
    f_other.mAccessType = NO_ACCESS;

#ifdef _WIN32
    mhFile = f_other.mhFile;
    f_other.mhFile = INVALID_HANDLE_VALUE;

    mhFileMapping = f_other.mhFileMapping;
    f_other.mhFileMapping = INVALID_HANDLE_VALUE;

    mFileSize = f_other.mFileSize;
    f_other.mFileSize = 0;
#else
    mFd = f_other.mFd;
    f_other.mFd = -1;

    mFileSize = f_other.mFileSize;
    f_other.mFileSize = 0;
#endif

    return *this;
}